

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_while_statement(Parser *this)

{
  AbstractSyntaxNode *pAVar1;
  Type local_354;
  Token local_350;
  Token local_2f8;
  Token local_2a0;
  Token local_248;
  Token local_1f0;
  stringstream buffer;
  
  _buffer = 0x2f;
  pAVar1 = AbstractSyntaxNode::add_child
                     (this->current_,(Type *)&buffer,
                      (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start + this->index_ % this->total_);
  this->current_ = pAVar1;
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
  local_354 = kWhile;
  match(&local_1f0,this,&local_354);
  Token::~Token(&local_1f0);
  local_354 = kLeftParen;
  match(&local_248,this,&local_354);
  Token::~Token(&local_248);
  parse_condition(this);
  local_354 = kRightParen;
  match(&local_2a0,this,&local_354);
  Token::~Token(&local_2a0);
  local_354 = kLeftBrace;
  match(&local_2f8,this,&local_354);
  Token::~Token(&local_2f8);
  local_354 = kStatements;
  pAVar1 = AbstractSyntaxNode::add_child
                     (this->current_,&local_354,
                      (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start + this->index_ % this->total_);
  this->current_ = pAVar1;
  while ((this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
         super__Vector_impl_data._M_start[this->index_ % this->total_].type_ != kRightBrace) {
    parse_statement(this,true);
  }
  local_354 = kRightBrace;
  match(&local_350,this,&local_354);
  Token::~Token(&local_350);
  this->current_ = this->current_->parent_->parent_;
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
  return;
}

Assistant:

void Parser::parse_while_statement() {
    current_ = current_->add_child(Token::Type::kWhileStatement, forward_token());
    std::stringstream buffer;

    match(Token::Type::kWhile);
    match(Token::Type::kLeftParen);
    parse_condition();
    match(Token::Type::kRightParen);
    match(Token::Type::kLeftBrace);
    current_ = current_->add_child(Token::Type::kStatements, forward_token());
    while (forward_token().type() != Token::Type::kRightBrace) {
        parse_statement();
    }
    match(Token::Type::kRightBrace);
    current_ = current_->parent();

    current_ = current_->parent();
}